

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.c
# Opt level: O2

char * env_get(char *s)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  if (s != (char *)0x0) {
    uVar1 = str_len(s);
    for (lVar3 = 0; *(char **)(_environ + lVar3) != (char *)0x0; lVar3 = lVar3 + 8) {
      iVar2 = str_start(*(char **)(_environ + lVar3),s);
      if ((iVar2 != 0) && (*(char *)(*(long *)(_environ + lVar3) + (ulong)uVar1) == '=')) {
        return (char *)(*(long *)(_environ + lVar3) + (ulong)uVar1 + 1);
      }
    }
  }
  return (char *)0x0;
}

Assistant:

extern /*@null@*/char *env_get(const char *s)
{
  int i;
  unsigned int len;

  if (!s) return 0;
  len = str_len(s);
  for (i = 0;environ[i];++i)
    if (str_start(environ[i],s) && (environ[i][len] == '='))
      return environ[i] + len + 1;
  return 0;
}